

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O2

IntegerType * __thiscall TypeHandler::setSigned(TypeHandler *this,IntegerType *ty)

{
  if (&((this->uint)._M_t.super___uniq_ptr_impl<IntType,_std::default_delete<IntType>_>._M_t.
        super__Tuple_impl<0UL,_IntType_*,_std::default_delete<IntType>_>.
        super__Head_base<0UL,_IntType_*,_false>._M_head_impl)->super_IntegerType == ty) {
    return &((this->sint)._M_t.super___uniq_ptr_impl<IntType,_std::default_delete<IntType>_>._M_t.
             super__Tuple_impl<0UL,_IntType_*,_std::default_delete<IntType>_>.
             super__Head_base<0UL,_IntType_*,_false>._M_head_impl)->super_IntegerType;
  }
  if (&((this->uchar)._M_t.super___uniq_ptr_impl<CharType,_std::default_delete<CharType>_>._M_t.
        super__Tuple_impl<0UL,_CharType_*,_std::default_delete<CharType>_>.
        super__Head_base<0UL,_CharType_*,_false>._M_head_impl)->super_IntegerType == ty) {
    return &((this->schar)._M_t.super___uniq_ptr_impl<CharType,_std::default_delete<CharType>_>._M_t
             .super__Tuple_impl<0UL,_CharType_*,_std::default_delete<CharType>_>.
             super__Head_base<0UL,_CharType_*,_false>._M_head_impl)->super_IntegerType;
  }
  if (&((this->ushort)._M_t.super___uniq_ptr_impl<ShortType,_std::default_delete<ShortType>_>._M_t.
        super__Tuple_impl<0UL,_ShortType_*,_std::default_delete<ShortType>_>.
        super__Head_base<0UL,_ShortType_*,_false>._M_head_impl)->super_IntegerType == ty) {
    return &((this->sshort)._M_t.super___uniq_ptr_impl<ShortType,_std::default_delete<ShortType>_>.
             _M_t.super__Tuple_impl<0UL,_ShortType_*,_std::default_delete<ShortType>_>.
             super__Head_base<0UL,_ShortType_*,_false>._M_head_impl)->super_IntegerType;
  }
  if (&((this->ulong)._M_t.super___uniq_ptr_impl<LongType,_std::default_delete<LongType>_>._M_t.
        super__Tuple_impl<0UL,_LongType_*,_std::default_delete<LongType>_>.
        super__Head_base<0UL,_LongType_*,_false>._M_head_impl)->super_IntegerType != ty) {
    return ty;
  }
  return &((this->slong)._M_t.super___uniq_ptr_impl<LongType,_std::default_delete<LongType>_>._M_t.
           super__Tuple_impl<0UL,_LongType_*,_std::default_delete<LongType>_>.
           super__Head_base<0UL,_LongType_*,_false>._M_head_impl)->super_IntegerType;
}

Assistant:

IntegerType* TypeHandler::setSigned(IntegerType* ty) {
#define TYPES(unsignedType,signedType) \
    do {\
        if (ty == unsignedType.get()) return signedType.get();\
    } while(0);

    TYPES(uint, sint);
    TYPES(uchar, schar);
    TYPES(ushort, sshort);
    TYPES(ulong, slong);

#undef TYPES
    return ty;
}